

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O3

string * join(string *__return_storage_ptr__,string *separator,
             vector<int,_std::allocator<int>_> *items)

{
  ulong uVar1;
  uint uVar2;
  long lVar3;
  stringstream s;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  lVar3 = (long)(items->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(items->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar3 != 0) {
    uVar2 = 1;
    uVar1 = 0;
    do {
      if (uVar2 != 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,(separator->_M_dataplus)._M_p,separator->_M_string_length);
      }
      std::ostream::operator<<
                (local_1a8,
                 (items->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar1]);
      uVar1 = (ulong)uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar1 < (ulong)(lVar3 >> 2));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string join (
  const std::string& separator,
  const std::vector<int>& items)
{
  std::stringstream s;
  auto size = items.size ();
  for (unsigned int i = 0; i < size; ++i)
  {
    if (i)
      s << separator;

    s << items[i];
  }

  return s.str ();
}